

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.c
# Opt level: O0

PKCS7 * d2i_PKCS7_bio(BIO *bp,PKCS7 **p7)

{
  PKCS7 *pPVar1;
  char *propq;
  OSSL_LIB_CTX *libctx;
  PKCS7 *ret;
  ASN1_ITEM *in_stack_00000018;
  PKCS7 *in_stack_00000030;
  
  PKCS7_it();
  pPVar1 = (PKCS7 *)ASN1_item_d2i_bio_ex
                              (in_stack_00000018,(BIO *)ret,libctx,(OSSL_LIB_CTX *)propq,(char *)bp)
  ;
  if (pPVar1 != (PKCS7 *)0x0) {
    ossl_pkcs7_resolve_libctx(in_stack_00000030);
  }
  return pPVar1;
}

Assistant:

PKCS7 *d2i_PKCS7_bio(BIO *bp, PKCS7 **p7)
{
    PKCS7 *ret;
    OSSL_LIB_CTX *libctx = NULL;
    const char *propq = NULL;

    if (p7 != NULL && *p7 != NULL) {
        libctx = (*p7)->ctx.libctx;
        propq = (*p7)->ctx.propq;
    }


    ret = ASN1_item_d2i_bio_ex(ASN1_ITEM_rptr(PKCS7), bp, p7, libctx, propq);
    if (ret != NULL)
        ossl_pkcs7_resolve_libctx(ret);
    return ret;
}